

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sx_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint in_ESI;
  void *in_RDI;
  uint8_t *in_R8;
  uint32_t in_R9D;
  uint8_t *in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i alVar8;
  __m128i v;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint32_t in_stack_00000018;
  uint32_t in_stack_00000020;
  __m128i v_res_b_1;
  __m128i v_m1_b_1;
  __m128i v_m0_b_1;
  __m128i v_r_hi_b_1;
  __m128i v_r_lo_b_1;
  __m128i v_r0_s_b_1;
  __m128i v_r_b_1;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_r_hi_b;
  __m128i v_r_lo_b;
  __m128i v_r0_s_b;
  __m128i v_r_b;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i v_shuffle_b;
  undefined4 in_stack_fffffffffffffcf4;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd08;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 in_stack_fffffffffffffd38 [16];
  undefined1 in_stack_fffffffffffffd48 [16];
  uint8_t *in_stack_fffffffffffffd58;
  undefined8 local_278;
  undefined8 uStack_270;
  uint8_t *src0_00;
  uint8_t *in_stack_fffffffffffffe28;
  uint8_t *puVar9;
  void *local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 in_stack_fffffffffffffe96;
  
  xx_loadu_128("");
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  src0_00 = auVar1._8_8_;
  auVar6 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar6 = vpinsrw_avx(auVar6,0x200,2);
  auVar6 = vpinsrw_avx(auVar6,0x200,3);
  auVar6 = vpinsrw_avx(auVar6,0x200,4);
  auVar6 = vpinsrw_avx(auVar6,0x200,5);
  auVar6 = vpinsrw_avx(auVar6,0x200,6);
  auVar6 = vpinsrw_avx(auVar6,0x200,7);
  local_198 = auVar6._0_8_;
  uStack_190 = auVar6._8_8_;
  local_1a8 = in_RDI;
  if (in_stack_00000018 == 4) {
    do {
      xx_loadl_64(in_stack_00000008);
      auVar7._8_8_ = uStack_190;
      auVar7._0_8_ = local_198;
      auVar6._8_8_ = in_XMM0_Qb;
      auVar6._0_8_ = in_XMM0_Qa;
      auVar6 = vpshufb_avx(auVar7,auVar6);
      auVar7 = vpunpcklqdq_avx(auVar6,auVar6);
      auVar6 = vpunpckhqdq_avx(auVar6,auVar6);
      auVar6 = vpavgb_avx(auVar7,auVar6);
      auVar2._8_8_ = src0_00;
      auVar2._0_8_ = auVar1._0_8_;
      auVar6 = vpsubb_avx(auVar2,auVar6);
      puVar9 = in_R8;
      alVar8 = blend_4_u8(in_stack_fffffffffffffd58,in_stack_fffffffffffffd48._8_8_,
                          in_stack_fffffffffffffd48._0_8_,in_stack_fffffffffffffd38._8_8_,
                          in_stack_fffffffffffffd38._0_8_);
      local_278 = auVar6._0_8_;
      uStack_270 = auVar6._8_8_;
      alVar8[0] = (longlong)in_R8;
      local_198 = local_278;
      uStack_190 = uStack_270;
      xx_storel_32(local_1a8,alVar8);
      local_1a8 = (void *)((long)local_1a8 + (ulong)in_ESI);
      in_R8 = puVar9 + in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)in_stack_00000010);
      in_stack_00000020 = in_stack_00000020 - 1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 8) {
    do {
      xx_loadu_128(in_stack_00000008);
      auVar4._8_8_ = uStack_190;
      auVar4._0_8_ = local_198;
      auVar3._8_8_ = in_XMM0_Qb;
      auVar3._0_8_ = in_XMM0_Qa;
      auVar6 = vpshufb_avx(auVar4,auVar3);
      auVar3 = vpunpcklqdq_avx(auVar6,auVar6);
      auVar2 = vpunpckhqdq_avx(auVar6,auVar6);
      auVar6 = vpavgb_avx(auVar3,auVar2);
      auVar5._8_8_ = src0_00;
      auVar5._0_8_ = auVar1._0_8_;
      auVar7 = vpsubb_avx(auVar5,auVar6);
      puVar9 = in_R8;
      alVar8 = blend_8_u8(auVar3._0_8_,auVar2._8_8_,auVar2._0_8_,auVar6._8_8_,auVar6._0_8_);
      v[1] = alVar8[1];
      local_2e8 = auVar7._0_8_;
      uStack_2e0 = auVar7._8_8_;
      v[0] = (longlong)in_R8;
      local_198 = local_2e8;
      uStack_190 = uStack_2e0;
      xx_storel_64(local_1a8,v);
      local_1a8 = (void *)((long)local_1a8 + (ulong)in_ESI);
      in_R8 = puVar9 + in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)in_stack_00000010);
      in_stack_00000020 = in_stack_00000020 - 1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 0x10) {
    blend_a64_mask_sx_w16_avx2
              (in_R8,in_R9D,in_stack_fffffffffffffe28,(uint32_t)((ulong)in_XMM0_Qb >> 0x20),
               in_XMM0_Qa,auVar1._12_4_,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_00000010),in_stack_00000020,
               in_stack_fffffffffffffd00);
  }
  else {
    blend_a64_mask_sx_w32n_avx2
              ((uint8_t *)0x4040404040404040,0x40404040,src0_00,auVar1._4_4_,
               (uint8_t *)CONCAT17(0x40,CONCAT16(in_stack_fffffffffffffe96,0x20002000200)),0x2000200
               ,(uint8_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_00000010),in_stack_00000018,
               in_stack_00000020,in_stack_fffffffffffffd08);
  }
  return;
}

Assistant:

static inline void blend_a64_mask_sx_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  switch (w) {
    case 4:
      do {
        const __m128i v_r_b = xx_loadl_64(mask);
        const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r_b, v_shuffle_b);
        const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r0_s_b);
        const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r0_s_b);
        const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

        const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_32(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += mask_stride;
      } while (--h);
      break;
    case 8:
      do {
        const __m128i v_r_b = xx_loadu_128(mask);
        const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r_b, v_shuffle_b);
        const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r0_s_b);
        const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r0_s_b);
        const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

        const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_64(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += mask_stride;
      } while (--h);
      break;
    case 16:
      blend_a64_mask_sx_w16_avx2(dst, dst_stride, src0, src0_stride, src1,
                                 src1_stride, mask, mask_stride, h);
      break;
    default:
      blend_a64_mask_sx_w32n_avx2(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h);
      break;
  }
}